

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::GLES2SharedRenderingPerfTests::init
          (GLES2SharedRenderingPerfTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  EglTestContext *pEVar3;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  TestCaseGroup *pTVar6;
  SharedRenderingPerfCase *pSVar7;
  int iVar8;
  _Alloc_hider _Var9;
  long lVar10;
  long lVar11;
  char *in_R8;
  TestConfig local_bc;
  TestNode *local_88;
  long local_80;
  long local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(this->super_TestCaseGroup).m_eglTestCtx,"no_shared_context",
             "Tests without sharing contexts.");
  lVar11 = 0;
  local_88 = (TestNode *)this;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = false;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        _Var9._M_p = local_70._M_dataplus._M_p;
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        iVar5 = (int)_Var9._M_p;
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = false;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "no_shared_resource","Tests without shared resources.");
  lVar11 = 0;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = false;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "shared_coord_buffer","Shared coordinate bufffer");
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = true;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = true;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = false;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar11 = local_80;
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "shared_index_buffer","Shared index bufffer");
  lVar11 = 0;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = true;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = true;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = false;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "shared_texture","Shared texture tests.");
  lVar11 = 0;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_SHARED_TEXTURE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_SHARED_TEXTURE;
        local_bc.sharedProgram = false;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "shared_program","Shared program tests.");
  lVar11 = 0;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = true;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_TEXTURE;
        local_bc.sharedProgram = true;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"shared_all"
             ,"Share all possible resources.");
  lVar11 = 0;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = true;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = true;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_SHARED_TEXTURE;
        local_bc.sharedProgram = true;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = true;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = true;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_SHARED_TEXTURE;
        local_bc.sharedProgram = true;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"egl_image",
             "EGL image tests.");
  lVar11 = 0;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = false;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_IMAGE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = false;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_IMAGE;
        local_bc.sharedProgram = false;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "shared_egl_image","Shared EGLImage tests.");
  lVar11 = 0;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = false;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_SHARED_IMAGE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = false;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_SHARED_IMAGE;
        local_bc.sharedProgram = false;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  pTVar6 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar6,(EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "shared_egl_image_texture","Shared EGLImage texture tests.");
  lVar11 = 0;
  while (lVar11 != 3) {
    uVar1 = (&DAT_017e8088)[lVar11];
    local_80 = lVar11;
    for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
      iVar2 = *(int *)((long)&DAT_017e8088 + lVar10);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_SHARED_IMAGE_TEXTURE;
        local_bc.sharedProgram = false;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        iVar8 = 1000;
        local_bc.drawCallCount = 1000;
        local_bc.triangleCount = 1;
        iVar4 = 10;
        if (iVar5 == 1) {
          iVar4 = 0x28;
        }
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        local_78 = lVar10;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        std::operator+(&local_70,&local_50,"_small_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_bc.sharedContexts = true;
        local_bc.useCoordBuffer = true;
        local_bc.sharedCoordBuffer = false;
        local_bc.useIndices = true;
        local_bc.useIndexBuffer = true;
        local_bc.sharedIndexBuffer = false;
        local_bc.useTexture = true;
        local_bc._27_1_ = 0;
        local_bc.textureType = TEXTURETYPE_SHARED_IMAGE_TEXTURE;
        local_bc.sharedProgram = false;
        iVar5 = (int)&local_bc + 0x21;
        local_bc.textureWidth = 0x80;
        local_bc.textureHeight = 0x80;
        local_bc.surfaceWidth = 0x100;
        local_bc.surfaceHeight = 0x100;
        local_bc.drawCallCount = 1;
        local_bc.triangleCount = 1000;
        local_bc.threadCount = uVar1;
        local_bc.perThreadContextCount = iVar2;
        local_bc.frameCount = iVar4;
        pSVar7 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_88[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        std::operator+(&local_70,&local_50,"_big_call");
        egl::anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar7,pEVar3,&local_bc,local_70._M_dataplus._M_p,in_R8);
        tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        lVar10 = local_78;
        this = (GLES2SharedRenderingPerfTests *)local_88;
      }
    }
    lVar11 = local_80 + 1;
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
  return extraout_EAX;
}

Assistant:

void GLES2SharedRenderingPerfTests::init (void)
{
	TestConfig basicConfig;

	basicConfig.threadCount					= 1;
	basicConfig.perThreadContextCount		= 1;

	basicConfig.sharedContexts				= true;
	basicConfig.frameCount					= 10;
	basicConfig.drawCallCount				= 10;
	basicConfig.triangleCount				= 100;

	basicConfig.useCoordBuffer				= true;
	basicConfig.sharedCoordBuffer			= false;

	basicConfig.useIndices					= true;
	basicConfig.useIndexBuffer				= true;
	basicConfig.sharedIndexBuffer			= false;

	basicConfig.useTexture					= true;
	basicConfig.textureType					= TestConfig::TEXTURETYPE_TEXTURE;

	basicConfig.sharedProgram				= false;

	basicConfig.textureWidth				= 128;
	basicConfig.textureHeight				= 128;

	basicConfig.surfaceWidth				= 256;
	basicConfig.surfaceHeight				= 256;

	const int	threadCounts[]				= { 1, 2, 4 };
	const int	perThreadContextCounts[]	= { 1, 2, 4 };

	// Add no sharing tests
	{
		TestCaseGroup* sharedNoneGroup = new TestCaseGroup(m_eglTestCtx, "no_shared_context", "Tests without sharing contexts.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedNoneGroup);
	}

	// Add no resource sharing tests
	{
		TestCaseGroup* sharedNoneGroup = new TestCaseGroup(m_eglTestCtx, "no_shared_resource", "Tests without shared resources.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedNoneGroup);
	}

	// Add shared coord buffer tests
	{
		TestCaseGroup* sharedCoordBufferGroup = new TestCaseGroup(m_eglTestCtx, "shared_coord_buffer", "Shared coordinate bufffer");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedCoordBuffer		= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedCoordBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedCoordBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedCoordBufferGroup);
	}

	// Add shared index buffer tests
	{
		TestCaseGroup* sharedIndexBufferGroup = new TestCaseGroup(m_eglTestCtx, "shared_index_buffer", "Shared index bufffer");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedIndexBuffer		= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedIndexBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedIndexBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedIndexBufferGroup);
	}

	// Add shared texture tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_texture", "Shared texture tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Add shared program tests
	{
		TestCaseGroup* sharedProgramGroup = new TestCaseGroup(m_eglTestCtx, "shared_program", "Shared program tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedProgram			= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedProgramGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedProgramGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedProgramGroup);
	}

	// Add shared all tests
	{
		TestCaseGroup* sharedallGroup = new TestCaseGroup(m_eglTestCtx, "shared_all", "Share all possible resources.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedCoordBuffer		= true;
				config.sharedIndexBuffer		= true;
				config.sharedProgram			= true;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedallGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedallGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedallGroup);
	}

	// Add EGLImage tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "egl_image", "EGL image tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config = basicConfig;

				config.textureType				= TestConfig::TEXTURETYPE_IMAGE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Add shared EGLImage tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_egl_image", "Shared EGLImage tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;

				config.textureType				= TestConfig::TEXTURETYPE_SHARED_IMAGE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Shared EGLImage texture test
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_egl_image_texture", "Shared EGLImage texture tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_IMAGE_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

}